

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutils.c
# Opt level: O0

void pstrcpy(char *buf,int buf_size,char *str)

{
  char *q;
  int c;
  char *str_local;
  int buf_size_local;
  char *buf_local;
  
  q = buf;
  str_local = str;
  if (0 < buf_size) {
    while( true ) {
      if ((*str_local == '\0') || (buf + (long)buf_size + -1 <= q)) break;
      *q = *str_local;
      q = q + 1;
      str_local = str_local + 1;
    }
    *q = '\0';
  }
  return;
}

Assistant:

void pstrcpy(char *buf, int buf_size, const char *str)
{
    int c;
    char *q = buf;

    if (buf_size <= 0)
        return;

    for(;;) {
        c = *str++;
        if (c == 0 || q >= buf + buf_size - 1)
            break;
        *q++ = c;
    }
    *q = '\0';
}